

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker_thread.hpp
# Opt level: O0

void boost::threadpool::detail::
     worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
     ::create_and_attach(shared_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
                         *pool)

{
  bool bVar1;
  worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
  *p;
  type pwVar2;
  shared_ptr<boost::thread> *this;
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
  worker;
  shared_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
  *in_stack_ffffffffffffff68;
  worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
  *in_stack_ffffffffffffff70;
  shared_ptr<boost::thread> *p_00;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  element_type *in_stack_ffffffffffffffa8;
  shared_count in_stack_ffffffffffffffb0;
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
  *in_stack_ffffffffffffffd8;
  F in_stack_ffffffffffffffe0;
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
  local_18;
  
  p = (worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
       *)operator_new(0x30);
  worker_thread(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>
  ::
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>
            ((shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
              *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),p);
  bVar1 = shared_ptr::operator_cast_to_bool((shared_ptr *)&local_18);
  if (bVar1) {
    pwVar2 = shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
             ::operator->(&local_18);
    p_00 = &pwVar2->m_thread;
    this = (shared_ptr<boost::thread> *)operator_new(0x10);
    shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
    ::shared_ptr((shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
                  *)&stack0xffffffffffffffa8,
                 (shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
                  *)in_stack_ffffffffffffff68);
    bind<void,boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>,boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    thread::
    thread<boost::_bi::bind_t<void,boost::_mfi::mf0<void,boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>,boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>>>>>
              ((thread *)in_stack_ffffffffffffffb0.pi_,
               (bind_t<void,_boost::_mfi::mf0<void,_boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>_>
                *)in_stack_ffffffffffffffa8);
    shared_ptr<boost::thread>::reset<boost::thread>(this,(thread *)p_00);
    _bi::
    bind_t<void,_boost::_mfi::mf0<void,_boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>_>
    ::~bind_t((bind_t<void,_boost::_mfi::mf0<void,_boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>_>
               *)0x190f4f);
    shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
    ::~shared_ptr((shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
                   *)0x190f59);
  }
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
  ::~shared_ptr((shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
                 *)0x190fd9);
  return;
}

Assistant:

static void create_and_attach(shared_ptr<pool_type> const & pool)
	  {
		  shared_ptr<worker_thread> worker(new worker_thread(pool));
		  if(worker)
		  {
			  worker->m_thread.reset(new boost::thread(bind(&worker_thread::run, worker)));
		  }
	  }